

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O0

void matras_dealloc_range(matras *m,matras_id_t range_count)

{
  matras_id_t range_count_local;
  matras *m_local;
  
  if ((m->head).block_count % (ulong)range_count != 0) {
    __assert_fail("m->head.block_count % range_count == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x14c,"void matras_dealloc_range(struct matras *, matras_id_t)");
  }
  if ((int)(((ulong)m->extent_size / (ulong)m->block_size) % (ulong)range_count) == 0) {
    (m->head).block_count = (m->head).block_count - (ulong)(range_count - 1);
    matras_dealloc(m);
    return;
  }
  __assert_fail("m->extent_size / m->block_size % range_count == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                ,0x14d,"void matras_dealloc_range(struct matras *, matras_id_t)");
}

Assistant:

void
matras_dealloc_range(struct matras *m, matras_id_t range_count)
{
	assert(m->head.block_count % range_count == 0);
	assert(m->extent_size / m->block_size % range_count == 0);
	m->head.block_count -= (range_count - 1);
	matras_dealloc(m);
}